

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_connection.cpp
# Opt level: O2

int __thiscall cpp_db::sqlite_connection::open(sqlite_connection *this,char *__file,int __oflag,...)

{
  sqlite3 *psVar1;
  int iVar2;
  int extraout_EAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  db_exception *this_00;
  sqlite_exception *this_01;
  sqlite3 *__tmp;
  __allocator_type __a2;
  sqlite3 *dbptr;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  string local_48;
  
  iVar2 = (*(this->super_connection_interface)._vptr_connection_interface[4])(this,__file,___oflag);
  if ((char)iVar2 != '\0') {
    this_00 = (db_exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Database already open",(allocator<char> *)&local_58);
    db_exception::db_exception(this_00,&local_48);
    __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  dbptr = (sqlite3 *)0x0;
  iVar2 = sqlite3_open_v2(*(undefined8 *)__file,&dbptr,6,0);
  psVar1 = dbptr;
  if (iVar2 == 0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    local_48._M_dataplus._M_p = (pointer)&__a2;
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00192aa8;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)psVar1;
    local_48._M_string_length = 0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<sqlite3_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/sqlite/sqlite_connection.cpp:26:21),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<sqlite3_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JohannAnhofer[P]cpp_db_sqlite_sqlite_connection_cpp:26:21),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_48);
    local_58 = (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Stack_50._M_pi =
         (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr = psVar1;
    (this->db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    return extraout_EAX;
  }
  this_01 = (sqlite_exception *)__cxa_allocate_exception(0x18);
  sqlite_exception::sqlite_exception(this_01,iVar2,dbptr);
  __cxa_throw(this_01,&sqlite_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sqlite_connection::open(const std::string &database, const authentication &, const key_value_pair &)
{
    if (is_open())
        throw db_exception("Database already open");

    sqlite3 *dbptr(nullptr);
    if (int error_code = sqlite3_open_v2(database.c_str(), &dbptr, SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, nullptr))
        throw sqlite_exception(error_code, dbptr);
    db.reset(dbptr, [](sqlite3 *db)
    {
        if (int error_code = sqlite3_close(db))
            throw sqlite_exception(error_code, db);
    }
    );
}